

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O3

void __thiscall
Units_checkScalingFactorImportedModel_Test::~Units_checkScalingFactorImportedModel_Test
          (Units_checkScalingFactorImportedModel_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Units, checkScalingFactorImportedModel)
{
    libcellml::UnitsPtr u1 = libcellml::Units::create();
    u1->setName("u1");
    u1->addUnit(libcellml::Units::StandardUnit::RADIAN, 0, 1.0, 1.0);

    libcellml::UnitsPtr u2 = libcellml::Units::create();
    u2->setName("u2");
    u2->addUnit(libcellml::Units::StandardUnit::RADIAN, 0, 1.0, 1.0);

    libcellml::ModelPtr model = libcellml::Model::create();
    model->setName("model");
    model->addUnits(u1);

    libcellml::ImportSourcePtr import = libcellml::ImportSource::create();
    import->setUrl("I_am_a_url");
    import->setModel(model);

    model->addUnits(u1);
    model->addUnits(u2);

    EXPECT_EQ(1.0, libcellml::Units::scalingFactor(u1, u2));
    EXPECT_EQ(1.0, libcellml::Units::scalingFactor(u2, u1));
}